

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

string * __thiscall
cmOutputConverter::ConvertToOutputFormat
          (string *__return_storage_ptr__,cmOutputConverter *this,string *source,OutputFormat output
          )

{
  undefined1 uVar1;
  bool bVar2;
  cmState *pcVar3;
  ulong uVar4;
  char *pcVar5;
  undefined1 *puVar6;
  undefined1 auVar7 [16];
  string local_b0;
  string local_90;
  char local_6a [2];
  char *local_68;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  string local_48;
  undefined1 local_25;
  OutputFormat local_24;
  string *psStack_20;
  OutputFormat output_local;
  string *source_local;
  cmOutputConverter *this_local;
  string *result;
  
  local_25 = 0;
  local_24 = output;
  psStack_20 = source;
  source_local = (string *)this;
  this_local = (cmOutputConverter *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)source);
  if (local_24 == MAKERULE) {
    auVar7 = std::__cxx11::string::c_str();
    cmSystemTools::ConvertToOutputPath_abi_cxx11_(&local_48,auVar7._0_8_,auVar7._8_8_);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else if ((local_24 == SHELL) || (local_24 == WATCOMQUOTE)) {
    pcVar3 = GetState(this);
    bVar2 = cmState::UseMSYSShell(pcVar3);
    if ((bVar2) &&
       ((((this->LinkScriptShell & 1U) == 0 && (uVar4 = std::__cxx11::string::size(), 2 < uVar4)) &&
        (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__),
        *pcVar5 == ':')))) {
      puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
      uVar1 = *puVar6;
      puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
      *puVar6 = uVar1;
      puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
      *puVar6 = 0x2f;
    }
    pcVar3 = GetState(this);
    bVar2 = cmState::UseWindowsShell(pcVar3);
    if (bVar2) {
      local_60._M_current = (char *)std::__cxx11::string::begin();
      local_68 = (char *)std::__cxx11::string::end();
      local_6a[1] = 0x2f;
      local_6a[0] = '\\';
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (local_60,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )local_68,local_6a + 1,local_6a);
    }
    EscapeForShell(&local_90,this,__return_storage_ptr__,true,false,local_24 == WATCOMQUOTE);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  else if (local_24 == RESPONSE) {
    EscapeForShell(&local_b0,this,__return_storage_ptr__,false,false,false);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::ConvertToOutputFormat(const std::string& source,
                                                     OutputFormat output) const
{
  std::string result = source;
  // Convert it to an output path.
  if (output == MAKERULE)
    {
    result = cmSystemTools::ConvertToOutputPath(result.c_str());
    }
  else if(output == SHELL || output == WATCOMQUOTE)
    {
        // For the MSYS shell convert drive letters to posix paths, so
    // that c:/some/path becomes /c/some/path.  This is needed to
    // avoid problems with the shell path translation.
    if(this->GetState()->UseMSYSShell() && !this->LinkScriptShell)
      {
      if(result.size() > 2 && result[1] == ':')
        {
        result[1] = result[0];
        result[0] = '/';
        }
      }
    if(this->GetState()->UseWindowsShell())
      {
      std::replace(result.begin(), result.end(), '/', '\\');
      }
    result = this->EscapeForShell(result, true, false, output == WATCOMQUOTE);
    }
  else if(output == RESPONSE)
    {
    result = this->EscapeForShell(result, false, false, false);
    }
  return result;
}